

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

int Potassco::xconvert(char *x,unsigned_long_long *out,char **errPos,int param_4)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char *in_RDI;
  int tok;
  
  bVar1 = parseUnsigned((char **)out,(unsigned_long_long *)errPos,CONCAT44(param_4,tok));
  iVar2 = parsed((uint)bVar1,in_RDI,in_RDX);
  return iVar2;
}

Assistant:

int xconvert(const char* x, unsigned long long& out, const char** errPos, int) {
	int tok = parseUnsigned(x, out, ULLONG_MAX);
	return parsed(tok, x, errPos);
}